

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O0

void mc_abi_log(mc_abi *m)

{
  int local_14;
  int i;
  mc_abi *m_local;
  
  if (m != (mc_abi *)0x0) {
    printf("ArticulatedBodyInertiaCoord(\n");
    printf("  I=                     H=                     M=\n");
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      printf("  [%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&(m->second_moment_of_mass).field_0 + (long)local_14 * 0x18),
             *(undefined8 *)((long)&(m->second_moment_of_mass).field_0 + (long)local_14 * 0x18 + 8),
             *(undefined8 *)
              ((long)&(m->second_moment_of_mass).field_0 + (long)local_14 * 0x18 + 0x10));
      printf("  [%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&(m->first_moment_of_mass).field_0 + (long)local_14 * 0x18),
             *(undefined8 *)((long)&(m->first_moment_of_mass).field_0 + (long)local_14 * 0x18 + 8),
             *(undefined8 *)
              ((long)&(m->first_moment_of_mass).field_0 + (long)local_14 * 0x18 + 0x10));
      printf("  [%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&(m->zeroth_moment_of_mass).field_0 + (long)local_14 * 0x18),
             *(undefined8 *)((long)&(m->zeroth_moment_of_mass).field_0 + (long)local_14 * 0x18 + 8),
             *(undefined8 *)
              ((long)&(m->zeroth_moment_of_mass).field_0 + (long)local_14 * 0x18 + 0x10));
      if (local_14 != 2) {
        printf(",\n");
      }
    }
    printf(")\n");
    return;
  }
  __assert_fail("m",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x24f,"void mc_abi_log(const struct mc_abi *)");
}

Assistant:

void mc_abi_log(
        const struct mc_abi *m)
{
    assert(m);

    printf("ArticulatedBodyInertiaCoord(\n");
    printf("  I=                     H=                     M=\n");
    for (int i = 0; i < 3; i++) {
        printf("  [%5.2f, %5.2f, %5.2f]",
                m->second_moment_of_mass.row[i].x,
                m->second_moment_of_mass.row[i].y,
                m->second_moment_of_mass.row[i].z);
        printf("  [%5.2f, %5.2f, %5.2f]",
                m->first_moment_of_mass.row[i].x,
                m->first_moment_of_mass.row[i].y,
                m->first_moment_of_mass.row[i].z);
        printf("  [%5.2f, %5.2f, %5.2f]",
                m->zeroth_moment_of_mass.row[i].x,
                m->zeroth_moment_of_mass.row[i].y,
                m->zeroth_moment_of_mass.row[i].z);
        if (i != 2) printf(",\n");
    }
    printf(")\n");
}